

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

String * __thiscall
Jinx::Impl::ParseCell_abi_cxx11_
          (String *__return_storage_ptr__,Impl *this,char delimiter,char **current,char *end)

{
  char cVar1;
  char current_00;
  bool bVar2;
  undefined7 in_register_00000011;
  long *plVar3;
  char c;
  bool isQuoted;
  char *end_local;
  char **current_local;
  char delimiter_local;
  String *value;
  
  plVar3 = (long *)CONCAT71(in_register_00000011,delimiter);
  if ((char **)*plVar3 == current) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              (__return_storage_ptr__);
  }
  else {
    cVar1 = *(char *)*plVar3;
    if (cVar1 == '\"') {
      *plVar3 = *plVar3 + 1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              (__return_storage_ptr__);
    while ((char **)*plVar3 != current) {
      current_00 = *(char *)*plVar3;
      if (cVar1 == '\"') {
        if (current_00 == '\"') {
          *plVar3 = *plVar3 + 1;
          if ((char **)*plVar3 == current) {
            return __return_storage_ptr__;
          }
          if (*(char *)*plVar3 == (char)this) {
            return __return_storage_ptr__;
          }
          bVar2 = IsLineEnd(*(char *)*plVar3);
          if (bVar2) {
            return __return_storage_ptr__;
          }
          if (*(char *)*plVar3 != '\"') {
            __assert_fail("**current == \'\"\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                          ,0xe26,"String Jinx::Impl::ParseCell(char, const char **, const char *)");
          }
        }
      }
      else {
        if (current_00 == (char)this) {
          return __return_storage_ptr__;
        }
        bVar2 = IsLineEnd(current_00);
        if (bVar2) {
          return __return_storage_ptr__;
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                (__return_storage_ptr__,current_00);
      *plVar3 = *plVar3 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline String ParseCell(char delimiter, const char ** current, const char * end)
	{
		if (*current == end)
			return String();
		bool isQuoted = false;
		if (**current == '"')
		{
			isQuoted = true;
			++(*current);
		}
		String value;
		while (*current != end)
		{
			const char c = **current;
			if (isQuoted)
			{
				// Since this cell is double-quote delimited, proceed without checking delimiters until
				// we see another double quote character.
				if (c == '"')
				{
					// Advance the iterator and check to see if it's followed by the end of file or
					// delimiters.  If so, we're done parsing.  If not, a second double-quote should
					// follow.
					++(*current);
					if (*current == end || **current == delimiter || IsLineEnd(**current))
						break;
					// If this assert hits, your data is malformed, since an interior double-quote was not
					// followed by a second quote
					assert(**current == '"');
				}
			}
			else
			{
				// This isn't a quote-escaped cell, so check for normal delimiters
				if (c == delimiter || IsLineEnd(c))
					break;
			}
			value += c;
			++(*current);
		}
		return value;
	}